

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

uchar duckdb::MultiplyOperatorOverflowCheck::Operation<unsigned_char,unsigned_char,unsigned_char>
                (uchar left,uchar right)

{
  OutOfRangeException *this;
  PhysicalType type;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if ((char)((ushort)((ushort)right * (ushort)left) >> 8) == '\0') {
    return (uchar)((ushort)right * (ushort)left);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in multiplication of %s (%s * %s)!",&local_99);
  TypeIdToString_abi_cxx11_(&local_58,(duckdb *)0x2,type);
  NumericHelper::ToString<unsigned_char>(&local_78,left);
  NumericHelper::ToString<unsigned_char>(&local_98,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
             &local_78,&local_98);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}